

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_helpers.cc
# Opt level: O3

int google::protobuf::compiler::java::GetExperimentalJavaFieldType(FieldDescriptor *field)

{
  FieldDescriptor FVar1;
  long lVar2;
  bool bVar3;
  JavaType JVar4;
  int iVar5;
  Descriptor *pDVar6;
  FieldDescriptor *field_00;
  byte bVar7;
  uint uVar8;
  uint uVar9;
  FieldDescriptor *local_48;
  undefined1 local_40 [32];
  
  FVar1 = field[1];
  if (*(once_flag **)(field + 0x18) != (once_flag *)0x0) {
    local_40._0_8_ = FieldDescriptor::TypeOnceInit;
    local_48 = field;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(field + 0x18),(_func_void_FieldDescriptor_ptr **)local_40,&local_48);
  }
  uVar8 = (uint)(((byte)FVar1 & 0x60) == 0x40) * 0x100;
  uVar9 = uVar8;
  if (field[2] == (FieldDescriptor)0x9) {
    if (*(char *)(*(long *)(field + 0x10) + 0x3a) == '\x03') {
      uVar9 = uVar8 | 0x200;
    }
    else {
      uVar9 = uVar8 + 0x200;
      if (*(char *)(*(long *)(*(long *)(field + 0x10) + 0x78) + 0x9a) == '\0') {
        uVar9 = uVar8;
      }
    }
  }
  if (((byte)field[1] & 0x60) != 0x40) {
    JVar4 = GetJavaType(field);
    if (JVar4 != JAVATYPE_MESSAGE) goto LAB_0024c863;
    pDVar6 = FieldDescriptor::message_type(field);
    bVar3 = HasRequiredFields(pDVar6);
    if (!bVar3) goto LAB_0024c863;
  }
  uVar9 = uVar9 | 0x400;
LAB_0024c863:
  bVar7 = (byte)field[1] & 0x60;
  uVar8 = uVar9;
  if (bVar7 != 0x60) {
    if ((((byte)field[1] & 2) == 0) &&
       ((bVar7 != 0x20 || (*(char *)(*(long *)(field + 0x10) + 0x3a) != '\x02')))) {
      uVar8 = uVar9 + 0x1000;
      if (*(char *)(*(long *)(field + 0x10) + 0x3a) != '\x02') {
        uVar8 = uVar9;
      }
    }
    else {
      uVar8 = uVar9 | 0x1000;
    }
  }
  if (*(once_flag **)(field + 0x18) != (once_flag *)0x0) {
    local_40._0_8_ = FieldDescriptor::TypeOnceInit;
    local_48 = field;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(field + 0x18),(_func_void_FieldDescriptor_ptr **)local_40,&local_48);
  }
  if ((field[2] == (FieldDescriptor)0xb) &&
     (bVar3 = FieldDescriptor::is_map_message_type(field), bVar3)) {
    uVar9 = uVar8;
    if (*(char *)(*(long *)(field + 0x10) + 0x3a) != '\x03') {
      pDVar6 = FieldDescriptor::message_type(field);
      local_40._0_8_ = local_40 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_40,"value","");
      field_00 = Descriptor::FindFieldByName(pDVar6,(ConstStringParam)local_40);
      if ((undefined1 *)local_40._0_8_ != local_40 + 0x10) {
        operator_delete((void *)local_40._0_8_);
      }
      JVar4 = GetJavaType(field_00);
      uVar9 = uVar8 | 0x800;
      if (JVar4 != JAVATYPE_ENUM) {
        uVar9 = uVar8;
      }
    }
    uVar9 = uVar9 | 0x32;
  }
  else {
    bVar3 = FieldDescriptor::is_packed(field);
    if (bVar3) {
      uVar9 = GetExperimentalJavaFieldTypeForPacked(field);
    }
    else {
      if ((~(byte)field[1] & 0x60) == 0) {
        uVar9 = GetExperimentalJavaFieldTypeForRepeated(field);
      }
      else {
        lVar2 = *(long *)(field + 0x28);
        if ((lVar2 == 0 || ((byte)field[1] & 0x10) == 0) ||
           ((*(int *)(lVar2 + 4) == 1 && ((*(byte *)(*(long *)(lVar2 + 0x20) + 1) & 2) != 0)))) {
          uVar9 = GetExperimentalJavaFieldTypeForSingular(field);
        }
        else {
          iVar5 = GetExperimentalJavaFieldTypeForSingular(field);
          uVar9 = iVar5 + 0x33;
        }
      }
      uVar9 = uVar9 | uVar8;
    }
  }
  return uVar9;
}

Assistant:

int GetExperimentalJavaFieldType(const FieldDescriptor* field) {
  static const int kMapFieldType = 50;
  static const int kOneofFieldTypeOffset = 51;
  static const int kRequiredBit = 0x100;
  static const int kUtf8CheckBit = 0x200;
  static const int kCheckInitialized = 0x400;
  static const int kMapWithProto2EnumValue = 0x800;
  static const int kHasHasBit = 0x1000;
  int extra_bits = field->is_required() ? kRequiredBit : 0;
  if (field->type() == FieldDescriptor::TYPE_STRING && CheckUtf8(field)) {
    extra_bits |= kUtf8CheckBit;
  }
  if (field->is_required() || (GetJavaType(field) == JAVATYPE_MESSAGE &&
                               HasRequiredFields(field->message_type()))) {
    extra_bits |= kCheckInitialized;
  }
  if (HasHasbit(field)) {
    extra_bits |= kHasHasBit;
  }

  if (field->is_map()) {
    if (!SupportUnknownEnumValue(field)) {
      const FieldDescriptor* value =
          field->message_type()->FindFieldByName("value");
      if (GetJavaType(value) == JAVATYPE_ENUM) {
        extra_bits |= kMapWithProto2EnumValue;
      }
    }
    return kMapFieldType | extra_bits;
  } else if (field->is_packed()) {
    return GetExperimentalJavaFieldTypeForPacked(field);
  } else if (field->is_repeated()) {
    return GetExperimentalJavaFieldTypeForRepeated(field) | extra_bits;
  } else if (IsRealOneof(field)) {
    return (GetExperimentalJavaFieldTypeForSingular(field) +
            kOneofFieldTypeOffset) |
           extra_bits;
  } else {
    return GetExperimentalJavaFieldTypeForSingular(field) | extra_bits;
  }
}